

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledMisc.cpp
# Opt level: O2

Box2i __thiscall
Imf_3_4::dataWindowForTile
          (Imf_3_4 *this,TileDescription *tileDesc,int minX,int maxX,int minY,int maxY,int dx,int dy
          ,int lx,int ly)

{
  long lVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  Box2i BVar6;
  Imf_3_4 local_40 [8];
  int local_38;
  int local_34;
  
  iVar3 = dx * tileDesc->xSize + minX;
  iVar5 = dy * tileDesc->ySize + minY;
  lVar4 = (ulong)tileDesc->xSize + (long)iVar3 + -1;
  lVar1 = ((ulong)tileDesc->ySize - 1) + (long)iVar5;
  BVar6 = dataWindowForLevel(local_40,tileDesc,minX,maxX,minY,maxY,lx,ly);
  lVar2 = (long)local_38;
  if (lVar4 < local_38) {
    lVar2 = lVar4;
  }
  lVar4 = (long)local_34;
  if (lVar1 < local_34) {
    lVar4 = lVar1;
  }
  *(int *)this = iVar3;
  *(int *)(this + 4) = iVar5;
  *(int *)(this + 8) = (int)lVar2;
  *(int *)(this + 0xc) = (int)lVar4;
  BVar6.min = (Vec2<int>)this;
  return BVar6;
}

Assistant:

Box2i
dataWindowForTile (
    const TileDescription& tileDesc,
    int                    minX,
    int                    maxX,
    int                    minY,
    int                    maxY,
    int                    dx,
    int                    dy,
    int                    lx,
    int                    ly)
{
    V2i tileMin = V2i (minX + dx * tileDesc.xSize, minY + dy * tileDesc.ySize);

    int64_t tileMaxX = int64_t (tileMin[0]) + tileDesc.xSize - 1;
    int64_t tileMaxY = int64_t (tileMin[1]) + tileDesc.ySize - 1;

    V2i levelMax =
        dataWindowForLevel (tileDesc, minX, maxX, minY, maxY, lx, ly).max;

    V2i tileMax = V2i (
        std::min (tileMaxX, int64_t (levelMax[0])),
        std::min (tileMaxY, int64_t (levelMax[1])));

    return Box2i (tileMin, tileMax);
}